

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall
jsonnet::internal::Unparser::unparseFields(Unparser *this,ObjectFields *fields,bool space_before)

{
  pointer pOVar1;
  ostream *poVar2;
  bool bVar3;
  byte bVar4;
  AST **ppAVar5;
  pointer field;
  string local_50;
  
  field = (fields->
          super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
          )._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (fields->
           super__Vector_base<jsonnet::internal::ObjectField,_std::allocator<jsonnet::internal::ObjectField>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  bVar3 = true;
  do {
    if (field == pOVar1) {
      return;
    }
    if (!bVar3) {
      std::operator<<(this->o,',');
    }
    if (LOCAL < field->kind) goto LAB_001aefec;
    bVar4 = ~bVar3;
    switch(field->kind) {
    case ASSERT:
      fill(this,&field->fodder1,(bool)((bVar4 | space_before) & 1),true);
      std::operator<<(this->o,"assert");
      unparse(this,field->expr2,true);
      if (field->expr3 == (AST *)0x0) goto LAB_001aefec;
      ppAVar5 = &field->expr3;
      fill(this,&field->opFodder,true,true);
      std::operator<<(this->o,":");
      goto LAB_001aefde;
    case FIELD_ID:
      fill(this,&field->fodder1,(bool)((bVar4 | space_before) & 1),true);
      poVar2 = this->o;
      encode_utf8(&local_50,&field->id->name);
      std::operator<<(poVar2,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      break;
    case FIELD_EXPR:
      fill(this,&field->fodder1,(bool)((bVar4 | space_before) & 1),true);
      std::operator<<(this->o,"[");
      unparse(this,field->expr1,false);
      fill(this,&field->fodder2,false,false);
      std::operator<<(this->o,"]");
      break;
    case FIELD_STR:
      unparse(this,field->expr1,(bool)((bVar4 | space_before) & 1));
      break;
    case LOCAL:
      fill(this,&field->fodder1,(bool)((bVar4 | space_before) & 1),true);
      std::operator<<(this->o,"local");
      fill(this,&field->fodder2,true,true);
      poVar2 = this->o;
      encode_utf8(&local_50,&field->id->name);
      std::operator<<(poVar2,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      unparseFieldParams(this,field);
      fill(this,&field->opFodder,true,true);
      std::operator<<(this->o,"=");
      ppAVar5 = &field->expr2;
      goto LAB_001aefde;
    }
    unparseFieldParams(this,field);
    fill(this,&field->opFodder,false,false);
    if (field->superSugar == true) {
      std::operator<<(this->o,"+");
    }
    if ((ulong)field->hide < 3) {
      std::operator<<(this->o,*(char **)(&DAT_00233c90 + (ulong)field->hide * 8));
    }
    ppAVar5 = &field->expr2;
LAB_001aefde:
    unparse(this,*ppAVar5,true);
LAB_001aefec:
    bVar3 = false;
    fill(this,&field->commaFodder,false,false);
    field = field + 1;
  } while( true );
}

Assistant:

void unparseFields(const ObjectFields &fields, bool space_before)
    {
        bool first = true;
        for (const auto &field : fields) {
            if (!first)
                o << ',';

            switch (field.kind) {
                case ObjectField::LOCAL: {
                    fill(field.fodder1, !first || space_before, true);
                    o << "local";
                    fill(field.fodder2, true, true);
                    o << unparse_id(field.id);
                    unparseFieldParams(field);
                    fill(field.opFodder, true, true);
                    o << "=";
                    unparse(field.expr2, true);
                } break;

                case ObjectField::FIELD_ID:
                case ObjectField::FIELD_STR:
                case ObjectField::FIELD_EXPR: {
                    if (field.kind == ObjectField::FIELD_ID) {
                        fill(field.fodder1, !first || space_before, true);
                        o << unparse_id(field.id);

                    } else if (field.kind == ObjectField::FIELD_STR) {
                        unparse(field.expr1, !first || space_before);

                    } else if (field.kind == ObjectField::FIELD_EXPR) {
                        fill(field.fodder1, !first || space_before, true);
                        o << "[";
                        unparse(field.expr1, false);
                        fill(field.fodder2, false, false);
                        o << "]";
                    }
                    unparseFieldParams(field);

                    fill(field.opFodder, false, false);

                    if (field.superSugar)
                        o << "+";
                    switch (field.hide) {
                        case ObjectField::INHERIT: o << ":"; break;
                        case ObjectField::HIDDEN: o << "::"; break;
                        case ObjectField::VISIBLE: o << ":::"; break;
                    }
                    unparse(field.expr2, true);

                } break;

                case ObjectField::ASSERT: {
                    fill(field.fodder1, !first || space_before, true);
                    o << "assert";
                    unparse(field.expr2, true);
                    if (field.expr3 != nullptr) {
                        fill(field.opFodder, true, true);
                        o << ":";
                        unparse(field.expr3, true);
                    }
                } break;
            }

            first = false;
            fill(field.commaFodder, false, false);
        }
    }